

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextGenerator.cpp
# Opt level: O3

void __thiscall TextGenerator::generate(TextGenerator *this,ostream *output,ScName *stmName)

{
  ScModel *pSVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  ScName local_68;
  _Rb_tree_node_base *local_48;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  pSVar1 = (this->super_AbstractGenerator).m_model;
  if (stmName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"Note: discarding a state-machine name\n",0x26);
  }
  p_Var3 = (pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != local_40) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(output,"Name: ",6);
      hlText(&local_68,this,(ScName *)(p_Var3 + 1));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,"Parent: ",8);
      hlText(&local_68,this,(ScName *)(p_Var3 + 2));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      local_48 = p_Var3;
      if (p_Var3[4]._M_left != p_Var3[4]._M_parent) {
        uVar8 = 0;
        do {
          p_Var3 = local_48;
          std::__ostream_insert<char,std::char_traits<char>>(output,"Substates (",0xb);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)output);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
          p_Var4 = p_Var3[4]._M_parent;
          lVar5 = uVar8 * 0x50;
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,*(char **)((long)p_Var4 + lVar5),
                              *(long *)((long)p_Var4 + lVar5 + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]:\n",3);
          p_Var4 = p_Var3[4]._M_parent;
          p_Var6 = (_Rb_tree_node_base *)((long)p_Var4 + lVar5 + 0x28);
          p_Var3 = *(_Rb_tree_node_base **)((long)p_Var4 + lVar5 + 0x38);
          if (p_Var3 != p_Var6) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(output,"    ",4);
              hlText(&local_68,this,(ScName *)(p_Var3 + 1));
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 (output,local_68._M_dataplus._M_p,local_68._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
            } while (p_Var3 != p_Var6);
            p_Var4 = local_48[4]._M_parent;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(((long)local_48[4]._M_left - (long)p_Var4 >> 4) *
                                -0x3333333333333333));
      }
      p_Var3 = local_48;
      if (local_48[6]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"Transitions:\n",0xd);
        p_Var4 = p_Var3[5]._M_right;
        local_38 = (_Rb_tree_node_base *)&p_Var3[5]._M_parent;
        if (p_Var4 != local_38) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(output,"==> ",4);
            hlText(&local_68,this,(ScName *)(p_Var4 + 1));
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,local_68._M_dataplus._M_p,local_68._M_string_length);
            bVar9 = p_Var4[2]._M_color == _S_red;
            pcVar7 = " (history)\n";
            if (bVar9) {
              pcVar7 = "\n";
            }
            lVar5 = 0xb;
            if (bVar9) {
              lVar5 = 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar7,lVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            for (p_Var3 = *(_Rb_tree_node_base **)(p_Var4 + 3);
                p_Var3 != (_Rb_tree_node_base *)&p_Var4[2]._M_left;
                p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
              std::__ostream_insert<char,std::char_traits<char>>(output,"    ** ",7);
              hlText(&local_68,this,(ScName *)(p_Var3 + 1));
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 (output,local_68._M_dataplus._M_p,local_68._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
            p_Var3 = local_48;
          } while (p_Var4 != local_38);
        }
      }
      if (p_Var3[7]._M_right != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"Deferrals:\n",0xb);
        for (p_Var6 = p_Var3[7]._M_parent; p_Var6 != (_Rb_tree_node_base *)&p_Var3[6]._M_right;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"    ",4);
          hlText(&local_68,this,(ScName *)(p_Var6 + 1));
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,local_68._M_dataplus._M_p,local_68._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_40);
  }
  std::ostream::flush();
  return;
}

Assistant:

void TextGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << "Name: " << hlText(name) << "\n";
        output << "Parent: " << hlText(state.parent) << "\n";
        for (ScRegionNum i = 0; i < state.regions.size(); i++) {
            output << "Substates (" << i << ") [" << state.regions[i].initial << "]:\n";
            for (const auto &substate : state.regions[i].states) {
                output << "    " << hlText(substate) << "\n";
            }
        }
        if (!state.transitions.empty()) {
            output << "Transitions:\n";
            for (const auto &[target, events] : state.transitions) {
                output << "==> " << hlText(target.name)
                       << (target.historyMode != ScHistoryMode::None ? " (history)\n" : "\n");
                for (const auto &event : events) {
                    output << "    ** " << hlText(event) << "\n";
                }
            }
        }
        if (!state.deferrals.empty()) {
            output << "Deferrals:\n";
            for (const auto &event : state.deferrals) {
                output << "    " << hlText(event) << "\n";
            }
        }
        output << "\n";
    }

    output.flush();
}